

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void __thiscall
sf::priv::RenderTextureImplFBO::updateTexture(RenderTextureImplFBO *this,uint param_1)

{
  _func_void_GLenum_GLuint *p_Var1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  bool local_71;
  _Self local_58;
  _Self local_50;
  _Self local_48;
  iterator multisampleIter;
  _Self local_30;
  iterator iter;
  Lock lock;
  Uint64 contextId;
  uint param_1_local;
  RenderTextureImplFBO *this_local;
  
  if (((((this->m_multisample & 1U) != 0) && (this->m_width != 0)) && (this->m_height != 0)) &&
     (uVar3 = (*(this->super_RenderTextureImpl)._vptr_RenderTextureImpl[3])(this,1),
     (uVar3 & 1) != 0)) {
    lock.m_mutex = (Mutex *)Context::getActiveContextId();
    Lock::Lock((Lock *)&iter,(Mutex *)&(anonymous_namespace)::mutex);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::find(&this->m_frameBuffers,(key_type_conflict *)&lock);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::find(&this->m_multisampleFrameBuffers,(key_type_conflict *)&lock);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(&this->m_frameBuffers);
    bVar2 = std::operator!=(&local_30,&local_50);
    local_71 = false;
    if (bVar2) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
           ::end(&this->m_multisampleFrameBuffers);
      local_71 = std::operator!=(&local_48,&local_58);
    }
    p_Var1 = sf_ptrc_glBindFramebufferEXT;
    if (local_71 != false) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->(&local_30);
      (*p_Var1)(0x8ca9,ppVar4->second);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x251,"GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second)");
      (*sf_ptrc_glBlitFramebufferEXT)
                (0,0,this->m_width,this->m_height,0,0,this->m_width,this->m_height,0x4000,0x2600);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x252,
                   "GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST)"
                  );
      p_Var1 = sf_ptrc_glBindFramebufferEXT;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->(&local_48);
      (*p_Var1)(0x8ca9,ppVar4->second);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x253,
                   "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second)");
    }
    Lock::~Lock((Lock *)&iter);
  }
  return;
}

Assistant:

void RenderTextureImplFBO::updateTexture(unsigned int)
{
    // If multisampling is enabled, we need to resolve by blitting
    // from our FBO with multisample renderbuffer attachments
    // to our FBO to which our target texture is attached

#ifndef SFML_OPENGL_ES

    // In case of multisampling, make sure both FBOs
    // are already available within the current context
    if (m_multisample && m_width && m_height && activate(true))
    {
        Uint64 contextId = Context::getActiveContextId();

        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.find(contextId);
        std::map<Uint64, unsigned int>::iterator multisampleIter = m_multisampleFrameBuffers.find(contextId);

        if ((iter != m_frameBuffers.end()) && (multisampleIter != m_multisampleFrameBuffers.end()))
        {
            // Set up the blit target (draw framebuffer) and blit (from the read framebuffer, our multisample FBO)
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second));
            glCheck(GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST));
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second));
        }
    }

#endif // SFML_OPENGL_ES

}